

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive.cpp
# Opt level: O3

bool __thiscall ON_BinaryArchive::Read3dmV1Layer(ON_BinaryArchive *this,ON_Layer **layer)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  ON_Layer *pOVar4;
  size_t sVar5;
  wchar_t *component_name;
  char *pcVar6;
  ON__3dmV1LayerIndex *pOVar7;
  byte bVar8;
  ON__UINT32 tcode;
  ON_String s;
  ON__INT64 big_value;
  int slen;
  uint local_54;
  ON_String local_50;
  ON__INT64 local_48;
  uint local_40;
  anon_union_4_2_6147a14e_for_ON_Color_15 local_3c;
  ON_wString local_38;
  
  ON_String::ON_String(&local_50);
  do {
    local_54 = 0;
    local_48 = 0;
    bVar1 = BeginRead3dmBigChunk(this,&local_54,&local_48);
    if (!bVar1) break;
    if (local_54 == 0x400010) {
      pOVar4 = (ON_Layer *)operator_new(0xe8);
      ON_Layer::ON_Layer(pOVar4);
      *layer = pOVar4;
      iVar3 = this->m_3dm_v1_layer_index;
      this->m_3dm_v1_layer_index = iVar3 + 1;
      bVar1 = true;
      ON_ModelComponent::SetIndex((ON_ModelComponent *)pOVar4,iVar3);
      goto LAB_003a155f;
    }
    bVar1 = EndRead3dmChunk(this,false);
  } while (bVar1);
  bVar1 = false;
LAB_003a155f:
  if (*layer != (ON_Layer *)0x0) {
    do {
      local_54 = 0;
      local_48 = 0;
      bVar1 = BeginRead3dmBigChunk(this,&local_54,&local_48);
      if (!bVar1) {
LAB_003a16fc:
        bVar8 = 0;
        goto LAB_003a16fe;
      }
      if (local_54 == 0x80400001) {
        pOVar4 = *layer;
        ON_Color::ON_Color((ON_Color *)&local_3c,(uint)local_48);
        ON_Layer::SetColor(pOVar4,(ON_Color)local_3c);
      }
      else if (local_54 == 0x80400033) {
        bVar1 = local_48 == 2;
        if (bVar1) {
          ON_Layer::SetVisible(*layer,true);
        }
        else {
          ON_Layer::SetVisible(*layer,local_48 != 1);
        }
        ON_Layer::SetLocked(*layer,bVar1);
      }
      else if (local_54 == 0x400011) {
        local_40 = 0;
        ReadInt32(this,1,(ON__INT32 *)&local_40);
        if ((ulong)local_40 < 0x2711) {
          ON_String::SetLength(&local_50,(ulong)local_40);
          iVar3 = ON_String::Length(&local_50);
          pcVar6 = ON_String::Array(&local_50);
          sVar5 = Read(this,(long)iVar3,pcVar6);
          if (sVar5 == (long)iVar3) {
            pOVar4 = *layer;
            ON_wString::ON_wString(&local_38,&local_50);
            component_name = ON_wString::operator_cast_to_wchar_t_(&local_38);
            ON_ModelComponent::SetName(&pOVar4->super_ON_ModelComponent,component_name);
            ON_wString::~ON_wString(&local_38);
          }
        }
        else {
          ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_archive.cpp"
                     ,0x27eb,"","ON_BinaryArchive::Read3dmV1Layer() - invalid layer name length");
        }
      }
      bVar1 = EndRead3dmChunk(this,false);
      if (!bVar1) goto LAB_003a16fc;
    } while (local_54 != 0xffffffff);
    bVar8 = 1;
LAB_003a16fe:
    bVar1 = EndRead3dmChunk(this,false);
    pOVar4 = *layer;
    if ((bVar8 & bVar1) == 0) {
      if (pOVar4 != (ON_Layer *)0x0) {
        (*(pOVar4->super_ON_ModelComponent).super_ON_Object._vptr_ON_Object[4])();
        *layer = (ON_Layer *)0x0;
      }
      bVar1 = false;
    }
    else {
      bVar1 = true;
      if ((((pOVar4 != (ON_Layer *)0x0) &&
           (ON_ModelComponent::SetId(&pOVar4->super_ON_ModelComponent), this->m_mode == read3dm)) &&
          (this->m_3dm_opennurbs_version == 0)) && (this->m_3dm_version == 1)) {
        uVar2 = ON_String::Length(&local_50);
        pcVar6 = ON_String::Array(&local_50);
        iVar3 = ON_ModelComponent::Index(&(*layer)->super_ON_ModelComponent);
        if (((pcVar6 != (char *)0x0) && (uVar2 - 1 < 0xff)) && ((-1 < iVar3 && (*pcVar6 != '\0'))))
        {
          pOVar7 = (ON__3dmV1LayerIndex *)oncalloc(1,(ulong)(uVar2 + 0x19));
          pOVar7->m_layer_name = (char *)(pOVar7 + 1);
          iVar3 = ON_ModelComponent::Index(&(*layer)->super_ON_ModelComponent);
          pOVar7->m_layer_index = iVar3;
          pOVar7->m_layer_name_length = uVar2;
          memcpy(pOVar7->m_layer_name,pcVar6,(ulong)uVar2);
          pOVar7->m_layer_name[uVar2] = '\0';
          pOVar7->m_next = this->m_V1_layer_list;
          this->m_V1_layer_list = pOVar7;
        }
      }
    }
  }
  ON_String::~ON_String(&local_50);
  return bVar1;
}

Assistant:

bool ON_BinaryArchive::Read3dmV1Layer( ON_Layer*& layer )
{
  ON_String s;
  bool rc = 0;
  ON__UINT32 tcode;
  ON__INT64 big_value;
  for (;;) 
  {
    tcode = 0;
    big_value = 0;
    if (!BeginRead3dmBigChunk(&tcode,&big_value))
      break; // assume we are at the end of the file
    if ( tcode == TCODE_LAYER ) {
      layer = new ON_Layer();
      layer->SetIndex(m_3dm_v1_layer_index++);
      rc = 1;
      break;
    }
    if (!EndRead3dmChunk())
       break;
  }
  if ( layer ) {
    rc = false;
    for (;;) 
    {
      tcode = 0;
      big_value = 0;
      if (!BeginRead3dmBigChunk(&tcode,&big_value))
        break;
      switch(tcode) 
      {
      case TCODE_LAYERNAME:
        {
          int slen = 0;
          ReadInt(&slen);
          if ( slen < 0 || slen > 10000 )
          {
            ON_ERROR("ON_BinaryArchive::Read3dmV1Layer() - invalid layer name length");
          }
          else
          {
            s.SetLength(slen);
            if ( ReadByte( s.Length(), s.Array() ) )
            {
              layer->SetName(ON_wString(s));
            }
          }
        }
        break;
      case TCODE_RGB:
        {
          ON__UINT64 rgb64 = (ON__UINT64)big_value;
          ON__UINT32 rgb32 = (ON__UINT32)rgb64;
          layer->SetColor( ON_Color((ON__UINT32)rgb32) );
        }
        break;
      case TCODE_LAYERSTATE:
        switch (big_value) 
        {
        case 1: // hidden
          layer->SetVisible(false);
          layer->SetLocked(false);
          break;
        case 2: // locked
          layer->SetVisible(true);
          layer->SetLocked(true);
          break;
        default: // normal
          layer->SetVisible(true);
          layer->SetLocked(false);
          break;
        }
        break;
      }
      if (!EndRead3dmChunk())
         break;
      if ( TCODE_ENDOFTABLE == tcode ) {
        rc = true;
        break;
      }
    }
    if ( !EndRead3dmChunk() ) // end of TCODE_LAYER chunk
      rc = false;
  }
  if ( !rc && layer ) 
  {
    delete layer;
    layer = 0;
  }
  else if (rc && layer)
  {
    // V1 files did not have layer ids.
    layer->SetId();
    if (    ON::archive_mode::read3dm == m_mode
         && 0 == m_3dm_opennurbs_version
         && 1 == m_3dm_version
         )
    {
      // save layer index and name in a linked list.
      int s_length = s.Length();
      const char* s_name = s.Array();
      if (    layer->Index() >= 0
           && s_length > 0
           && s_length < 256
           && 0 != s_name
           && 0 != s_name[0] 
         )
      {
        struct ON__3dmV1LayerIndex* p = (struct ON__3dmV1LayerIndex*)oncalloc(1, sizeof(*p) + (s_length+1)*sizeof(*p->m_layer_name) );
        p->m_layer_name = (char*)(p+1);
        p->m_layer_index = layer->Index();
        p->m_layer_name_length = s_length;
        memcpy(p->m_layer_name,s_name,s_length*sizeof(*p->m_layer_name));
        p->m_layer_name[s_length] = 0;
        p->m_next = m_V1_layer_list;
        m_V1_layer_list = p;
      }
    }
  }
  return rc;
}